

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

bool_t wwIsW(word *a,size_t n,word w)

{
  bool_t ret;
  word w_local;
  size_t n_local;
  word *a_local;
  
  if (n == 0) {
    ret = (bool_t)(w == 0);
  }
  else {
    ret = (bool_t)(*a == w);
    n_local = n;
    while (n_local = n_local - 1, n_local != 0) {
      ret = (uint)(a[n_local] == 0) & ret;
    }
  }
  return ret;
}

Assistant:

bool_t SAFE(wwIsW)(const word a[], size_t n, register word w)
{
	register bool_t ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = wordEq(w, 0);
	else
	{
		ret = wordEq(a[0], w);
		while (--n)
			ret &= wordEq(a[n], 0);
	}
	w = 0;
	return ret;
}